

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaItemListRemove(xmlSchemaItemListPtr list,int idx)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = -1;
  if (list->items != (void **)0x0) {
    iVar1 = list->nbItems;
    if (idx < iVar1) {
      if (iVar1 == 1) {
        (*xmlFree)(list->items);
        list->items = (void **)0x0;
        list->nbItems = 0;
        list->sizeItems = 0;
      }
      else {
        iVar3 = (int)((long)iVar1 + -1);
        if (iVar3 == idx) {
          list->nbItems = idx;
        }
        else {
          for (lVar2 = (long)idx; lVar2 < (long)iVar1 + -1; lVar2 = lVar2 + 1) {
            list->items[lVar2] = list->items[lVar2 + 1];
          }
          list->nbItems = iVar3;
        }
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
xmlSchemaItemListRemove(xmlSchemaItemListPtr list, int idx)
{
    int i;
    if ((list->items == NULL) || (idx >= list->nbItems))
	return(-1);

    if (list->nbItems == 1) {
	/* TODO: Really free the list? */
	xmlFree(list->items);
	list->items = NULL;
	list->nbItems = 0;
	list->sizeItems = 0;
    } else if (list->nbItems -1 == idx) {
	list->nbItems--;
    } else {
	for (i = idx; i < list->nbItems -1; i++)
	    list->items[i] = list->items[i+1];
	list->nbItems--;
    }
    return(0);
}